

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O1

void __thiscall
IRBuilderAsmJs::BuildUint16x8_3Int8
          (IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset,RegSlot dstRegSlot,
          RegSlot src1RegSlot,RegSlot src2RegSlot,RegSlot src3RegSlot,RegSlot src4RegSlot,
          RegSlot src5RegSlot,RegSlot src6RegSlot,RegSlot src7RegSlot,RegSlot src8RegSlot,
          RegSlot src9RegSlot,RegSlot src10RegSlot)

{
  code *pcVar1;
  OpndKind OVar2;
  bool bVar3;
  RegOpnd *this_00;
  RegOpnd *pRVar4;
  RegOpnd *src1;
  RegOpnd *src1_00;
  RegOpnd *src1_01;
  RegOpnd *src1_02;
  RegOpnd *src1_03;
  RegOpnd *src1_04;
  RegOpnd *src1_05;
  RegOpnd *src1_06;
  RegOpnd *src1_07;
  Instr *pIVar5;
  undefined4 *puVar6;
  
  this_00 = BuildDstOpnd(this,dstRegSlot,TySimd128U8);
  pRVar4 = BuildSrcOpnd(this,src1RegSlot,TySimd128U8);
  src1 = BuildSrcOpnd(this,src2RegSlot,TySimd128U8);
  src1_00 = BuildIntConstOpnd(this,src3RegSlot);
  src1_01 = BuildIntConstOpnd(this,src4RegSlot);
  src1_02 = BuildIntConstOpnd(this,src5RegSlot);
  src1_03 = BuildIntConstOpnd(this,src6RegSlot);
  src1_04 = BuildIntConstOpnd(this,src7RegSlot);
  src1_05 = BuildIntConstOpnd(this,src8RegSlot);
  src1_06 = BuildIntConstOpnd(this,src9RegSlot);
  src1_07 = BuildIntConstOpnd(this,src10RegSlot);
  IR::Opnd::SetValueType(&this_00->super_Opnd,(ValueType)0x4000);
  IR::Opnd::SetValueType(&pRVar4->super_Opnd,(ValueType)0x4000);
  IR::Opnd::SetValueType(&src1->super_Opnd,(ValueType)0x4000);
  pIVar5 = AddExtendedArg(this,pRVar4,(RegOpnd *)0x0,offset);
  pRVar4 = (RegOpnd *)pIVar5->m_dst;
  OVar2 = IR::Opnd::GetKind((Opnd *)pRVar4);
  if (OVar2 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) goto LAB_0050ca93;
    *puVar6 = 0;
  }
  pIVar5 = AddExtendedArg(this,src1,pRVar4,offset);
  pRVar4 = (RegOpnd *)pIVar5->m_dst;
  OVar2 = IR::Opnd::GetKind((Opnd *)pRVar4);
  if (OVar2 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) goto LAB_0050ca93;
    *puVar6 = 0;
  }
  pIVar5 = AddExtendedArg(this,src1_00,pRVar4,offset);
  pRVar4 = (RegOpnd *)pIVar5->m_dst;
  OVar2 = IR::Opnd::GetKind((Opnd *)pRVar4);
  if (OVar2 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) goto LAB_0050ca93;
    *puVar6 = 0;
  }
  pIVar5 = AddExtendedArg(this,src1_01,pRVar4,offset);
  pRVar4 = (RegOpnd *)pIVar5->m_dst;
  OVar2 = IR::Opnd::GetKind((Opnd *)pRVar4);
  if (OVar2 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) goto LAB_0050ca93;
    *puVar6 = 0;
  }
  pIVar5 = AddExtendedArg(this,src1_02,pRVar4,offset);
  pRVar4 = (RegOpnd *)pIVar5->m_dst;
  OVar2 = IR::Opnd::GetKind((Opnd *)pRVar4);
  if (OVar2 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) goto LAB_0050ca93;
    *puVar6 = 0;
  }
  pIVar5 = AddExtendedArg(this,src1_03,pRVar4,offset);
  pRVar4 = (RegOpnd *)pIVar5->m_dst;
  OVar2 = IR::Opnd::GetKind((Opnd *)pRVar4);
  if (OVar2 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) goto LAB_0050ca93;
    *puVar6 = 0;
  }
  pIVar5 = AddExtendedArg(this,src1_04,pRVar4,offset);
  pRVar4 = (RegOpnd *)pIVar5->m_dst;
  OVar2 = IR::Opnd::GetKind((Opnd *)pRVar4);
  if (OVar2 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) goto LAB_0050ca93;
    *puVar6 = 0;
  }
  pIVar5 = AddExtendedArg(this,src1_05,pRVar4,offset);
  pRVar4 = (RegOpnd *)pIVar5->m_dst;
  OVar2 = IR::Opnd::GetKind((Opnd *)pRVar4);
  if (OVar2 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) goto LAB_0050ca93;
    *puVar6 = 0;
  }
  pIVar5 = AddExtendedArg(this,src1_06,pRVar4,offset);
  pRVar4 = (RegOpnd *)pIVar5->m_dst;
  OVar2 = IR::Opnd::GetKind((Opnd *)pRVar4);
  if (OVar2 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) goto LAB_0050ca93;
    *puVar6 = 0;
  }
  pIVar5 = AddExtendedArg(this,src1_07,pRVar4,offset);
  if (newOpcode != Simd128_Shuffle_U8) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                       ,0x1644,"(newOpcode == Js::OpCodeAsmJs::Simd128_Shuffle_U8)",
                       "newOpcode == Js::OpCodeAsmJs::Simd128_Shuffle_U8");
    if (!bVar3) {
LAB_0050ca93:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  pIVar5 = IR::Instr::New(Simd128_Shuffle_U8,&this_00->super_Opnd,pIVar5->m_dst,this->m_func);
  AddInstr(this,pIVar5,offset);
  return;
}

Assistant:

void IRBuilderAsmJs::BuildUint16x8_3Int8(Js::OpCodeAsmJs newOpcode, uint32 offset, BUILD_SIMD_ARGS_REG11)
{
    IR::RegOpnd * dstOpnd = BuildDstOpnd(dstRegSlot, TySimd128U8);
    IR::RegOpnd * src1Opnd = BuildSrcOpnd(src1RegSlot, TySimd128U8);
    IR::RegOpnd * src2Opnd = BuildSrcOpnd(src2RegSlot, TySimd128U8);

    IR::RegOpnd * src3Opnd = BuildIntConstOpnd(src3RegSlot);
    IR::RegOpnd * src4Opnd = BuildIntConstOpnd(src4RegSlot);
    IR::RegOpnd * src5Opnd = BuildIntConstOpnd(src5RegSlot);
    IR::RegOpnd * src6Opnd = BuildIntConstOpnd(src6RegSlot);
    IR::RegOpnd * src7Opnd = BuildIntConstOpnd(src7RegSlot);
    IR::RegOpnd * src8Opnd = BuildIntConstOpnd(src8RegSlot);
    IR::RegOpnd * src9Opnd = BuildIntConstOpnd(src9RegSlot);
    IR::RegOpnd * src10Opnd = BuildIntConstOpnd(src10RegSlot);

    IR::Instr * instr = nullptr;
    dstOpnd->SetValueType(ValueType::Simd);
    src1Opnd->SetValueType(ValueType::Simd);
    src2Opnd->SetValueType(ValueType::Simd);

    instr = AddExtendedArg(src1Opnd, nullptr, offset);
    instr = AddExtendedArg(src2Opnd, instr->GetDst()->AsRegOpnd(), offset);
    instr = AddExtendedArg(src3Opnd, instr->GetDst()->AsRegOpnd(), offset);
    instr = AddExtendedArg(src4Opnd, instr->GetDst()->AsRegOpnd(), offset);
    instr = AddExtendedArg(src5Opnd, instr->GetDst()->AsRegOpnd(), offset);
    instr = AddExtendedArg(src6Opnd, instr->GetDst()->AsRegOpnd(), offset);
    instr = AddExtendedArg(src7Opnd, instr->GetDst()->AsRegOpnd(), offset);
    instr = AddExtendedArg(src8Opnd, instr->GetDst()->AsRegOpnd(), offset);
    instr = AddExtendedArg(src9Opnd, instr->GetDst()->AsRegOpnd(), offset);
    instr = AddExtendedArg(src10Opnd, instr->GetDst()->AsRegOpnd(), offset);

    Assert(newOpcode == Js::OpCodeAsmJs::Simd128_Shuffle_U8);
    Js::OpCode opcode = Js::OpCode::Simd128_Shuffle_U8;

    AddInstr(IR::Instr::New(opcode, dstOpnd, instr->GetDst(), m_func), offset);
}